

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_tq1_0_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256 x_00;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 (*pauVar31) [32];
  long in_RCX;
  float *in_RSI;
  int in_EDI;
  long in_R9;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  __m256 d;
  __m256i ysum;
  __m256i qy45;
  __m256i qy23;
  __m256i qy01;
  __m256i qx45;
  __m128i qx5;
  __m256i qx23;
  __m256i qx01;
  __m128i qx4_1;
  __m128i qx3_1;
  __m128i qx2_1;
  __m128i qx1_1;
  __m256i qx5_l;
  uint32_t qh;
  __m128i qx0_1;
  __m256i qy4;
  __m256i qy3;
  __m256i qy2;
  __m256i qy1;
  __m256i qy0;
  __m256i qx4;
  __m256i qx3;
  __m256i qx2;
  __m256i qx1;
  __m256i qx0;
  __m256i sumi2;
  __m256i sumi1;
  __m256i sumi0;
  int i;
  __m256 sumf;
  int nb;
  block_q8_K *y;
  block_tq1_0 *x;
  undefined8 in_stack_ffffffffffffde18;
  undefined1 in_stack_ffffffffffffde20 [24];
  undefined8 local_20d0;
  undefined8 uStack_20c8;
  undefined8 local_2070;
  undefined8 uStack_2068;
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined1 auStack_2030 [16];
  undefined4 local_1e44;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_6e0 [16];
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0xff;
  }
  local_1e44 = 0;
  while( true ) {
    if (in_EDI >> 8 <= local_1e44) break;
    in_stack_ffffffffffffde18 = 0;
    pauVar31 = (undefined1 (*) [32])(in_RCX + (long)local_1e44 * 0x36);
    auVar6 = vpaddb_avx2(*pauVar31,*pauVar31);
    auVar6 = vpaddb_avx2(*pauVar31,auVar6);
    auVar7 = vpsllw_avx2(*pauVar31,ZEXT416(3));
    auVar3 = vpinsrb_avx(ZEXT116(0xf8),0xf8,1);
    auVar3 = vpinsrb_avx(auVar3,0xf8,2);
    auVar3 = vpinsrb_avx(auVar3,0xf8,3);
    auVar3 = vpinsrb_avx(auVar3,0xf8,4);
    auVar3 = vpinsrb_avx(auVar3,0xf8,5);
    auVar3 = vpinsrb_avx(auVar3,0xf8,6);
    auVar3 = vpinsrb_avx(auVar3,0xf8,7);
    auVar3 = vpinsrb_avx(auVar3,0xf8,8);
    auVar3 = vpinsrb_avx(auVar3,0xf8,9);
    auVar3 = vpinsrb_avx(auVar3,0xf8,10);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xd);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xe);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(0xf8),0xf8,1);
    auVar4 = vpinsrb_avx(auVar4,0xf8,2);
    auVar4 = vpinsrb_avx(auVar4,0xf8,3);
    auVar4 = vpinsrb_avx(auVar4,0xf8,4);
    auVar4 = vpinsrb_avx(auVar4,0xf8,5);
    auVar4 = vpinsrb_avx(auVar4,0xf8,6);
    auVar4 = vpinsrb_avx(auVar4,0xf8,7);
    auVar4 = vpinsrb_avx(auVar4,0xf8,8);
    auVar4 = vpinsrb_avx(auVar4,0xf8,9);
    auVar4 = vpinsrb_avx(auVar4,0xf8,10);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xb);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xc);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xd);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xe);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xf);
    uStack_550 = auVar4._0_8_;
    uStack_548 = auVar4._8_8_;
    auVar8._16_8_ = uStack_550;
    auVar8._0_16_ = auVar3;
    auVar8._24_8_ = uStack_548;
    auVar7 = vpand_avx2(auVar7,auVar8);
    auVar7 = vpaddb_avx2(auVar7,*pauVar31);
    auVar8 = vpsllw_avx2(auVar6,ZEXT416(3));
    auVar3 = vpinsrb_avx(ZEXT116(0xf8),0xf8,1);
    auVar3 = vpinsrb_avx(auVar3,0xf8,2);
    auVar3 = vpinsrb_avx(auVar3,0xf8,3);
    auVar3 = vpinsrb_avx(auVar3,0xf8,4);
    auVar3 = vpinsrb_avx(auVar3,0xf8,5);
    auVar3 = vpinsrb_avx(auVar3,0xf8,6);
    auVar3 = vpinsrb_avx(auVar3,0xf8,7);
    auVar3 = vpinsrb_avx(auVar3,0xf8,8);
    auVar3 = vpinsrb_avx(auVar3,0xf8,9);
    auVar3 = vpinsrb_avx(auVar3,0xf8,10);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xd);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xe);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(0xf8),0xf8,1);
    auVar4 = vpinsrb_avx(auVar4,0xf8,2);
    auVar4 = vpinsrb_avx(auVar4,0xf8,3);
    auVar4 = vpinsrb_avx(auVar4,0xf8,4);
    auVar4 = vpinsrb_avx(auVar4,0xf8,5);
    auVar4 = vpinsrb_avx(auVar4,0xf8,6);
    auVar4 = vpinsrb_avx(auVar4,0xf8,7);
    auVar4 = vpinsrb_avx(auVar4,0xf8,8);
    auVar4 = vpinsrb_avx(auVar4,0xf8,9);
    auVar4 = vpinsrb_avx(auVar4,0xf8,10);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xb);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xc);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xd);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xe);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xf);
    uStack_510 = auVar4._0_8_;
    uStack_508 = auVar4._8_8_;
    auVar9._16_8_ = uStack_510;
    auVar9._0_16_ = auVar3;
    auVar9._24_8_ = uStack_508;
    auVar8 = vpand_avx2(auVar8,auVar9);
    auVar8 = vpaddb_avx2(auVar8,auVar6);
    auVar9 = vpsllw_avx2(auVar7,ZEXT416(3));
    auVar3 = vpinsrb_avx(ZEXT116(0xf8),0xf8,1);
    auVar3 = vpinsrb_avx(auVar3,0xf8,2);
    auVar3 = vpinsrb_avx(auVar3,0xf8,3);
    auVar3 = vpinsrb_avx(auVar3,0xf8,4);
    auVar3 = vpinsrb_avx(auVar3,0xf8,5);
    auVar3 = vpinsrb_avx(auVar3,0xf8,6);
    auVar3 = vpinsrb_avx(auVar3,0xf8,7);
    auVar3 = vpinsrb_avx(auVar3,0xf8,8);
    auVar3 = vpinsrb_avx(auVar3,0xf8,9);
    auVar3 = vpinsrb_avx(auVar3,0xf8,10);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xd);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xe);
    auVar3 = vpinsrb_avx(auVar3,0xf8,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(0xf8),0xf8,1);
    auVar4 = vpinsrb_avx(auVar4,0xf8,2);
    auVar4 = vpinsrb_avx(auVar4,0xf8,3);
    auVar4 = vpinsrb_avx(auVar4,0xf8,4);
    auVar4 = vpinsrb_avx(auVar4,0xf8,5);
    auVar4 = vpinsrb_avx(auVar4,0xf8,6);
    auVar4 = vpinsrb_avx(auVar4,0xf8,7);
    auVar4 = vpinsrb_avx(auVar4,0xf8,8);
    auVar4 = vpinsrb_avx(auVar4,0xf8,9);
    auVar4 = vpinsrb_avx(auVar4,0xf8,10);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xb);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xc);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xd);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xe);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xf);
    uStack_4d0 = auVar4._0_8_;
    uStack_4c8 = auVar4._8_8_;
    auVar19._16_8_ = uStack_4d0;
    auVar19._0_16_ = auVar3;
    auVar19._24_8_ = uStack_4c8;
    auVar9 = vpand_avx2(auVar9,auVar19);
    auVar9 = vpaddb_avx2(auVar9,auVar7);
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auVar3 = vpinsrb_avx(auVar3,1,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar4 = vpinsrb_avx(auVar4,1,2);
    auVar4 = vpinsrb_avx(auVar4,1,3);
    auVar4 = vpinsrb_avx(auVar4,1,4);
    auVar4 = vpinsrb_avx(auVar4,1,5);
    auVar4 = vpinsrb_avx(auVar4,1,6);
    auVar4 = vpinsrb_avx(auVar4,1,7);
    auVar4 = vpinsrb_avx(auVar4,1,8);
    auVar4 = vpinsrb_avx(auVar4,1,9);
    auVar4 = vpinsrb_avx(auVar4,1,10);
    auVar4 = vpinsrb_avx(auVar4,1,0xb);
    auVar4 = vpinsrb_avx(auVar4,1,0xc);
    auVar4 = vpinsrb_avx(auVar4,1,0xd);
    auVar4 = vpinsrb_avx(auVar4,1,0xe);
    auVar4 = vpinsrb_avx(auVar4,1,0xf);
    uStack_490 = auVar4._0_8_;
    uStack_488 = auVar4._8_8_;
    auVar28._16_8_ = uStack_490;
    auVar28._0_16_ = auVar3;
    auVar28._24_8_ = uStack_488;
    auVar10 = vpsubusb_avx2(*pauVar31,auVar28);
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auVar3 = vpinsrb_avx(auVar3,1,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar4 = vpinsrb_avx(auVar4,1,2);
    auVar4 = vpinsrb_avx(auVar4,1,3);
    auVar4 = vpinsrb_avx(auVar4,1,4);
    auVar4 = vpinsrb_avx(auVar4,1,5);
    auVar4 = vpinsrb_avx(auVar4,1,6);
    auVar4 = vpinsrb_avx(auVar4,1,7);
    auVar4 = vpinsrb_avx(auVar4,1,8);
    auVar4 = vpinsrb_avx(auVar4,1,9);
    auVar4 = vpinsrb_avx(auVar4,1,10);
    auVar4 = vpinsrb_avx(auVar4,1,0xb);
    auVar4 = vpinsrb_avx(auVar4,1,0xc);
    auVar4 = vpinsrb_avx(auVar4,1,0xd);
    auVar4 = vpinsrb_avx(auVar4,1,0xe);
    auVar4 = vpinsrb_avx(auVar4,1,0xf);
    uStack_450 = auVar4._0_8_;
    uStack_448 = auVar4._8_8_;
    auVar27._16_8_ = uStack_450;
    auVar27._0_16_ = auVar3;
    auVar27._24_8_ = uStack_448;
    auVar11 = vpsubusb_avx2(auVar6,auVar27);
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auVar3 = vpinsrb_avx(auVar3,1,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar4 = vpinsrb_avx(auVar4,1,2);
    auVar4 = vpinsrb_avx(auVar4,1,3);
    auVar4 = vpinsrb_avx(auVar4,1,4);
    auVar4 = vpinsrb_avx(auVar4,1,5);
    auVar4 = vpinsrb_avx(auVar4,1,6);
    auVar4 = vpinsrb_avx(auVar4,1,7);
    auVar4 = vpinsrb_avx(auVar4,1,8);
    auVar4 = vpinsrb_avx(auVar4,1,9);
    auVar4 = vpinsrb_avx(auVar4,1,10);
    auVar4 = vpinsrb_avx(auVar4,1,0xb);
    auVar4 = vpinsrb_avx(auVar4,1,0xc);
    auVar4 = vpinsrb_avx(auVar4,1,0xd);
    auVar4 = vpinsrb_avx(auVar4,1,0xe);
    auVar4 = vpinsrb_avx(auVar4,1,0xf);
    uStack_410 = auVar4._0_8_;
    uStack_408 = auVar4._8_8_;
    auVar26._16_8_ = uStack_410;
    auVar26._0_16_ = auVar3;
    auVar26._24_8_ = uStack_408;
    auVar12 = vpsubusb_avx2(auVar7,auVar26);
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auVar3 = vpinsrb_avx(auVar3,1,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar4 = vpinsrb_avx(auVar4,1,2);
    auVar4 = vpinsrb_avx(auVar4,1,3);
    auVar4 = vpinsrb_avx(auVar4,1,4);
    auVar4 = vpinsrb_avx(auVar4,1,5);
    auVar4 = vpinsrb_avx(auVar4,1,6);
    auVar4 = vpinsrb_avx(auVar4,1,7);
    auVar4 = vpinsrb_avx(auVar4,1,8);
    auVar4 = vpinsrb_avx(auVar4,1,9);
    auVar4 = vpinsrb_avx(auVar4,1,10);
    auVar4 = vpinsrb_avx(auVar4,1,0xb);
    auVar4 = vpinsrb_avx(auVar4,1,0xc);
    auVar4 = vpinsrb_avx(auVar4,1,0xd);
    auVar4 = vpinsrb_avx(auVar4,1,0xe);
    auVar4 = vpinsrb_avx(auVar4,1,0xf);
    uStack_3d0 = auVar4._0_8_;
    uStack_3c8 = auVar4._8_8_;
    auVar7._16_8_ = uStack_3d0;
    auVar7._0_16_ = auVar3;
    auVar7._24_8_ = uStack_3c8;
    auVar13 = vpsubusb_avx2(auVar8,auVar7);
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auVar3 = vpinsrb_avx(auVar3,1,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar4 = vpinsrb_avx(auVar4,1,2);
    auVar4 = vpinsrb_avx(auVar4,1,3);
    auVar4 = vpinsrb_avx(auVar4,1,4);
    auVar4 = vpinsrb_avx(auVar4,1,5);
    auVar4 = vpinsrb_avx(auVar4,1,6);
    auVar4 = vpinsrb_avx(auVar4,1,7);
    auVar4 = vpinsrb_avx(auVar4,1,8);
    auVar4 = vpinsrb_avx(auVar4,1,9);
    auVar4 = vpinsrb_avx(auVar4,1,10);
    auVar4 = vpinsrb_avx(auVar4,1,0xb);
    auVar4 = vpinsrb_avx(auVar4,1,0xc);
    auVar4 = vpinsrb_avx(auVar4,1,0xd);
    auVar4 = vpinsrb_avx(auVar4,1,0xe);
    auVar4 = vpinsrb_avx(auVar4,1,0xf);
    uStack_390 = auVar4._0_8_;
    uStack_388 = auVar4._8_8_;
    auVar6._16_8_ = uStack_390;
    auVar6._0_16_ = auVar3;
    auVar6._24_8_ = uStack_388;
    auVar14 = vpsubusb_avx2(auVar9,auVar6);
    auVar6 = vpavgb_avx2(auVar10,ZEXT1632(ZEXT816(0)));
    auVar6 = vpavgb_avx2(auVar10,auVar6);
    auVar7 = vpavgb_avx2(auVar11,ZEXT1632(ZEXT816(0)));
    auVar7 = vpavgb_avx2(auVar11,auVar7);
    auVar8 = vpavgb_avx2(auVar12,ZEXT1632(ZEXT816(0)));
    auVar8 = vpavgb_avx2(auVar12,auVar8);
    auVar9 = vpavgb_avx2(auVar13,ZEXT1632(ZEXT816(0)));
    auVar9 = vpavgb_avx2(auVar13,auVar9);
    auVar10 = vpavgb_avx2(auVar14,ZEXT1632(ZEXT816(0)));
    auVar10 = vpavgb_avx2(auVar14,auVar10);
    auVar6 = vpsrlw_avx2(auVar6,ZEXT416(6));
    auVar3 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar3 = vpinsrb_avx(auVar3,3,2);
    auVar3 = vpinsrb_avx(auVar3,3,3);
    auVar3 = vpinsrb_avx(auVar3,3,4);
    auVar3 = vpinsrb_avx(auVar3,3,5);
    auVar3 = vpinsrb_avx(auVar3,3,6);
    auVar3 = vpinsrb_avx(auVar3,3,7);
    auVar3 = vpinsrb_avx(auVar3,3,8);
    auVar3 = vpinsrb_avx(auVar3,3,9);
    auVar3 = vpinsrb_avx(auVar3,3,10);
    auVar3 = vpinsrb_avx(auVar3,3,0xb);
    auVar3 = vpinsrb_avx(auVar3,3,0xc);
    auVar3 = vpinsrb_avx(auVar3,3,0xd);
    auVar3 = vpinsrb_avx(auVar3,3,0xe);
    auVar3 = vpinsrb_avx(auVar3,3,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar4 = vpinsrb_avx(auVar4,3,2);
    auVar4 = vpinsrb_avx(auVar4,3,3);
    auVar4 = vpinsrb_avx(auVar4,3,4);
    auVar4 = vpinsrb_avx(auVar4,3,5);
    auVar4 = vpinsrb_avx(auVar4,3,6);
    auVar4 = vpinsrb_avx(auVar4,3,7);
    auVar4 = vpinsrb_avx(auVar4,3,8);
    auVar4 = vpinsrb_avx(auVar4,3,9);
    auVar4 = vpinsrb_avx(auVar4,3,10);
    auVar4 = vpinsrb_avx(auVar4,3,0xb);
    auVar4 = vpinsrb_avx(auVar4,3,0xc);
    auVar4 = vpinsrb_avx(auVar4,3,0xd);
    auVar4 = vpinsrb_avx(auVar4,3,0xe);
    auVar4 = vpinsrb_avx(auVar4,3,0xf);
    uStack_350 = auVar4._0_8_;
    uStack_348 = auVar4._8_8_;
    auVar18._16_8_ = uStack_350;
    auVar18._0_16_ = auVar3;
    auVar18._24_8_ = uStack_348;
    auVar6 = vpand_avx2(auVar6,auVar18);
    auVar7 = vpsrlw_avx2(auVar7,ZEXT416(6));
    auVar3 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar3 = vpinsrb_avx(auVar3,3,2);
    auVar3 = vpinsrb_avx(auVar3,3,3);
    auVar3 = vpinsrb_avx(auVar3,3,4);
    auVar3 = vpinsrb_avx(auVar3,3,5);
    auVar3 = vpinsrb_avx(auVar3,3,6);
    auVar3 = vpinsrb_avx(auVar3,3,7);
    auVar3 = vpinsrb_avx(auVar3,3,8);
    auVar3 = vpinsrb_avx(auVar3,3,9);
    auVar3 = vpinsrb_avx(auVar3,3,10);
    auVar3 = vpinsrb_avx(auVar3,3,0xb);
    auVar3 = vpinsrb_avx(auVar3,3,0xc);
    auVar3 = vpinsrb_avx(auVar3,3,0xd);
    auVar3 = vpinsrb_avx(auVar3,3,0xe);
    auVar3 = vpinsrb_avx(auVar3,3,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar4 = vpinsrb_avx(auVar4,3,2);
    auVar4 = vpinsrb_avx(auVar4,3,3);
    auVar4 = vpinsrb_avx(auVar4,3,4);
    auVar4 = vpinsrb_avx(auVar4,3,5);
    auVar4 = vpinsrb_avx(auVar4,3,6);
    auVar4 = vpinsrb_avx(auVar4,3,7);
    auVar4 = vpinsrb_avx(auVar4,3,8);
    auVar4 = vpinsrb_avx(auVar4,3,9);
    auVar4 = vpinsrb_avx(auVar4,3,10);
    auVar4 = vpinsrb_avx(auVar4,3,0xb);
    auVar4 = vpinsrb_avx(auVar4,3,0xc);
    auVar4 = vpinsrb_avx(auVar4,3,0xd);
    auVar4 = vpinsrb_avx(auVar4,3,0xe);
    auVar4 = vpinsrb_avx(auVar4,3,0xf);
    uStack_310 = auVar4._0_8_;
    uStack_308 = auVar4._8_8_;
    auVar17._16_8_ = uStack_310;
    auVar17._0_16_ = auVar3;
    auVar17._24_8_ = uStack_308;
    auVar7 = vpand_avx2(auVar7,auVar17);
    auVar8 = vpsrlw_avx2(auVar8,ZEXT416(6));
    auVar3 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar3 = vpinsrb_avx(auVar3,3,2);
    auVar3 = vpinsrb_avx(auVar3,3,3);
    auVar3 = vpinsrb_avx(auVar3,3,4);
    auVar3 = vpinsrb_avx(auVar3,3,5);
    auVar3 = vpinsrb_avx(auVar3,3,6);
    auVar3 = vpinsrb_avx(auVar3,3,7);
    auVar3 = vpinsrb_avx(auVar3,3,8);
    auVar3 = vpinsrb_avx(auVar3,3,9);
    auVar3 = vpinsrb_avx(auVar3,3,10);
    auVar3 = vpinsrb_avx(auVar3,3,0xb);
    auVar3 = vpinsrb_avx(auVar3,3,0xc);
    auVar3 = vpinsrb_avx(auVar3,3,0xd);
    auVar3 = vpinsrb_avx(auVar3,3,0xe);
    auVar3 = vpinsrb_avx(auVar3,3,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar4 = vpinsrb_avx(auVar4,3,2);
    auVar4 = vpinsrb_avx(auVar4,3,3);
    auVar4 = vpinsrb_avx(auVar4,3,4);
    auVar4 = vpinsrb_avx(auVar4,3,5);
    auVar4 = vpinsrb_avx(auVar4,3,6);
    auVar4 = vpinsrb_avx(auVar4,3,7);
    auVar4 = vpinsrb_avx(auVar4,3,8);
    auVar4 = vpinsrb_avx(auVar4,3,9);
    auVar4 = vpinsrb_avx(auVar4,3,10);
    auVar4 = vpinsrb_avx(auVar4,3,0xb);
    auVar4 = vpinsrb_avx(auVar4,3,0xc);
    auVar4 = vpinsrb_avx(auVar4,3,0xd);
    auVar4 = vpinsrb_avx(auVar4,3,0xe);
    auVar4 = vpinsrb_avx(auVar4,3,0xf);
    uStack_2d0 = auVar4._0_8_;
    uStack_2c8 = auVar4._8_8_;
    auVar16._16_8_ = uStack_2d0;
    auVar16._0_16_ = auVar3;
    auVar16._24_8_ = uStack_2c8;
    auVar8 = vpand_avx2(auVar8,auVar16);
    auVar9 = vpsrlw_avx2(auVar9,ZEXT416(6));
    auVar3 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar3 = vpinsrb_avx(auVar3,3,2);
    auVar3 = vpinsrb_avx(auVar3,3,3);
    auVar3 = vpinsrb_avx(auVar3,3,4);
    auVar3 = vpinsrb_avx(auVar3,3,5);
    auVar3 = vpinsrb_avx(auVar3,3,6);
    auVar3 = vpinsrb_avx(auVar3,3,7);
    auVar3 = vpinsrb_avx(auVar3,3,8);
    auVar3 = vpinsrb_avx(auVar3,3,9);
    auVar3 = vpinsrb_avx(auVar3,3,10);
    auVar3 = vpinsrb_avx(auVar3,3,0xb);
    auVar3 = vpinsrb_avx(auVar3,3,0xc);
    auVar3 = vpinsrb_avx(auVar3,3,0xd);
    auVar3 = vpinsrb_avx(auVar3,3,0xe);
    auVar3 = vpinsrb_avx(auVar3,3,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar4 = vpinsrb_avx(auVar4,3,2);
    auVar4 = vpinsrb_avx(auVar4,3,3);
    auVar4 = vpinsrb_avx(auVar4,3,4);
    auVar4 = vpinsrb_avx(auVar4,3,5);
    auVar4 = vpinsrb_avx(auVar4,3,6);
    auVar4 = vpinsrb_avx(auVar4,3,7);
    auVar4 = vpinsrb_avx(auVar4,3,8);
    auVar4 = vpinsrb_avx(auVar4,3,9);
    auVar4 = vpinsrb_avx(auVar4,3,10);
    auVar4 = vpinsrb_avx(auVar4,3,0xb);
    auVar4 = vpinsrb_avx(auVar4,3,0xc);
    auVar4 = vpinsrb_avx(auVar4,3,0xd);
    auVar4 = vpinsrb_avx(auVar4,3,0xe);
    auVar4 = vpinsrb_avx(auVar4,3,0xf);
    uStack_290 = auVar4._0_8_;
    uStack_288 = auVar4._8_8_;
    auVar15._16_8_ = uStack_290;
    auVar15._0_16_ = auVar3;
    auVar15._24_8_ = uStack_288;
    auVar9 = vpand_avx2(auVar9,auVar15);
    auVar10 = vpsrlw_avx2(auVar10,ZEXT416(6));
    auVar3 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar3 = vpinsrb_avx(auVar3,3,2);
    auVar3 = vpinsrb_avx(auVar3,3,3);
    auVar3 = vpinsrb_avx(auVar3,3,4);
    auVar3 = vpinsrb_avx(auVar3,3,5);
    auVar3 = vpinsrb_avx(auVar3,3,6);
    auVar3 = vpinsrb_avx(auVar3,3,7);
    auVar3 = vpinsrb_avx(auVar3,3,8);
    auVar3 = vpinsrb_avx(auVar3,3,9);
    auVar3 = vpinsrb_avx(auVar3,3,10);
    auVar3 = vpinsrb_avx(auVar3,3,0xb);
    auVar3 = vpinsrb_avx(auVar3,3,0xc);
    auVar3 = vpinsrb_avx(auVar3,3,0xd);
    auVar3 = vpinsrb_avx(auVar3,3,0xe);
    auVar3 = vpinsrb_avx(auVar3,3,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar4 = vpinsrb_avx(auVar4,3,2);
    auVar4 = vpinsrb_avx(auVar4,3,3);
    auVar4 = vpinsrb_avx(auVar4,3,4);
    auVar4 = vpinsrb_avx(auVar4,3,5);
    auVar4 = vpinsrb_avx(auVar4,3,6);
    auVar4 = vpinsrb_avx(auVar4,3,7);
    auVar4 = vpinsrb_avx(auVar4,3,8);
    auVar4 = vpinsrb_avx(auVar4,3,9);
    auVar4 = vpinsrb_avx(auVar4,3,10);
    auVar4 = vpinsrb_avx(auVar4,3,0xb);
    auVar4 = vpinsrb_avx(auVar4,3,0xc);
    auVar4 = vpinsrb_avx(auVar4,3,0xd);
    auVar4 = vpinsrb_avx(auVar4,3,0xe);
    auVar4 = vpinsrb_avx(auVar4,3,0xf);
    uStack_250 = auVar4._0_8_;
    uStack_248 = auVar4._8_8_;
    auVar11._16_8_ = uStack_250;
    auVar11._0_16_ = auVar3;
    auVar11._24_8_ = uStack_248;
    auVar10 = vpand_avx2(auVar10,auVar11);
    auVar6 = vpmaddubsw_avx2(auVar6,*(undefined1 (*) [32])(in_R9 + 4 + (long)local_1e44 * 0x124));
    auVar7 = vpmaddubsw_avx2(auVar7,*(undefined1 (*) [32])(in_R9 + 0x24 + (long)local_1e44 * 0x124))
    ;
    auVar8 = vpmaddubsw_avx2(auVar8,*(undefined1 (*) [32])(in_R9 + 0x44 + (long)local_1e44 * 0x124))
    ;
    auVar9 = vpmaddubsw_avx2(auVar9,*(undefined1 (*) [32])(in_R9 + 100 + (long)local_1e44 * 0x124));
    auVar10 = vpmaddubsw_avx2(auVar10,*(undefined1 (*) [32])
                                       (in_R9 + 0x84 + (long)local_1e44 * 0x124));
    auVar6 = vpaddw_avx2(auVar6,auVar7);
    auVar6 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar6);
    auVar7 = vpaddw_avx2(auVar8,auVar9);
    auVar7 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar7);
    auVar8 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar10);
    pauVar1 = (undefined1 (*) [16])(in_RCX + 0x20 + (long)local_1e44 * 0x36);
    uVar2 = *(uint *)(in_RCX + 0x30 + (long)local_1e44 * 0x36);
    auVar3 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar3 = vpinsrd_avx(auVar3,uVar2,2);
    auVar3 = vpinsrd_avx(auVar3,uVar2,3);
    auVar9 = vpmovzxbw_avx2(auVar3);
    auVar3 = vpaddb_avx(*pauVar1,*pauVar1);
    auVar3 = vpaddb_avx(*pauVar1,auVar3);
    auVar34 = vpsllw_avx(*pauVar1,ZEXT416(3));
    auVar4 = vpinsrb_avx(ZEXT116(0xf8),0xf8,1);
    auVar4 = vpinsrb_avx(auVar4,0xf8,2);
    auVar4 = vpinsrb_avx(auVar4,0xf8,3);
    auVar4 = vpinsrb_avx(auVar4,0xf8,4);
    auVar4 = vpinsrb_avx(auVar4,0xf8,5);
    auVar4 = vpinsrb_avx(auVar4,0xf8,6);
    auVar4 = vpinsrb_avx(auVar4,0xf8,7);
    auVar4 = vpinsrb_avx(auVar4,0xf8,8);
    auVar4 = vpinsrb_avx(auVar4,0xf8,9);
    auVar4 = vpinsrb_avx(auVar4,0xf8,10);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xb);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xc);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xd);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xe);
    auVar4 = vpinsrb_avx(auVar4,0xf8,0xf);
    auVar4 = vpand_avx(auVar34,auVar4);
    auVar4 = vpaddb_avx(auVar4,*pauVar1);
    local_2050 = auVar3._0_8_;
    uStack_2048 = auVar3._8_8_;
    auVar5 = vpsllw_avx(auVar3,ZEXT416(3));
    auVar34 = vpinsrb_avx(ZEXT116(0xf8),0xf8,1);
    auVar34 = vpinsrb_avx(auVar34,0xf8,2);
    auVar34 = vpinsrb_avx(auVar34,0xf8,3);
    auVar34 = vpinsrb_avx(auVar34,0xf8,4);
    auVar34 = vpinsrb_avx(auVar34,0xf8,5);
    auVar34 = vpinsrb_avx(auVar34,0xf8,6);
    auVar34 = vpinsrb_avx(auVar34,0xf8,7);
    auVar34 = vpinsrb_avx(auVar34,0xf8,8);
    auVar34 = vpinsrb_avx(auVar34,0xf8,9);
    auVar34 = vpinsrb_avx(auVar34,0xf8,10);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xb);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xc);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xd);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xe);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xf);
    auVar34 = vpand_avx(auVar5,auVar34);
    auVar3 = vpaddb_avx(auVar34,auVar3);
    auVar5 = vpsllw_avx(auVar4,ZEXT416(3));
    auVar34 = vpinsrb_avx(ZEXT116(0xf8),0xf8,1);
    auVar34 = vpinsrb_avx(auVar34,0xf8,2);
    auVar34 = vpinsrb_avx(auVar34,0xf8,3);
    auVar34 = vpinsrb_avx(auVar34,0xf8,4);
    auVar34 = vpinsrb_avx(auVar34,0xf8,5);
    auVar34 = vpinsrb_avx(auVar34,0xf8,6);
    auVar34 = vpinsrb_avx(auVar34,0xf8,7);
    auVar34 = vpinsrb_avx(auVar34,0xf8,8);
    auVar34 = vpinsrb_avx(auVar34,0xf8,9);
    auVar34 = vpinsrb_avx(auVar34,0xf8,10);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xb);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xc);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xd);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xe);
    auVar34 = vpinsrb_avx(auVar34,0xf8,0xf);
    auVar34 = vpand_avx(auVar5,auVar34);
    auVar34 = vpaddb_avx(auVar34,auVar4);
    local_2070 = auVar3._0_8_;
    uStack_2068 = auVar3._8_8_;
    auVar3 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar3 = vpinsrw_avx(auVar3,1,2);
    auVar3 = vpinsrw_avx(auVar3,1,3);
    auVar3 = vpinsrw_avx(auVar3,3,4);
    auVar3 = vpinsrw_avx(auVar3,3,5);
    auVar3 = vpinsrw_avx(auVar3,3,6);
    auVar3 = vpinsrw_avx(auVar3,3,7);
    auVar5 = vpinsrw_avx(ZEXT216(9),9,1);
    auVar5 = vpinsrw_avx(auVar5,9,2);
    auVar5 = vpinsrw_avx(auVar5,9,3);
    auVar5 = vpinsrw_avx(auVar5,0x1b,4);
    auVar5 = vpinsrw_avx(auVar5,0x1b,5);
    auVar5 = vpinsrw_avx(auVar5,0x1b,6);
    auVar5 = vpinsrw_avx(auVar5,0x1b,7);
    uStack_7d0 = auVar5._0_8_;
    uStack_7c8 = auVar5._8_8_;
    auVar29._16_8_ = uStack_7d0;
    auVar29._0_16_ = auVar3;
    auVar29._24_8_ = uStack_7c8;
    auVar9 = vpmullw_avx2(auVar9,auVar29);
    auVar3 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar3 = vpinsrw_avx(auVar3,0xff,2);
    auVar3 = vpinsrw_avx(auVar3,0xff,3);
    auVar3 = vpinsrw_avx(auVar3,0xff,4);
    auVar3 = vpinsrw_avx(auVar3,0xff,5);
    auVar3 = vpinsrw_avx(auVar3,0xff,6);
    auVar3 = vpinsrw_avx(auVar3,0xff,7);
    auVar5 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar5 = vpinsrw_avx(auVar5,0xff,2);
    auVar5 = vpinsrw_avx(auVar5,0xff,3);
    auVar5 = vpinsrw_avx(auVar5,0xff,4);
    auVar5 = vpinsrw_avx(auVar5,0xff,5);
    auVar5 = vpinsrw_avx(auVar5,0xff,6);
    auVar5 = vpinsrw_avx(auVar5,0xff,7);
    uStack_710 = auVar5._0_8_;
    uStack_708 = auVar5._8_8_;
    auVar10._16_8_ = uStack_710;
    auVar10._0_16_ = auVar3;
    auVar10._24_8_ = uStack_708;
    auVar9 = vpand_avx2(auVar9,auVar10);
    auStack_2030 = auVar9._16_16_;
    auVar3 = vpackuswb_avx(auStack_2030,local_6e0);
    local_20d0 = auVar3._0_8_;
    uStack_20c8 = auVar3._8_8_;
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auVar3 = vpinsrb_avx(auVar3,1,0xf);
    auVar5 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar5 = vpinsrb_avx(auVar5,1,2);
    auVar5 = vpinsrb_avx(auVar5,1,3);
    auVar5 = vpinsrb_avx(auVar5,1,4);
    auVar5 = vpinsrb_avx(auVar5,1,5);
    auVar5 = vpinsrb_avx(auVar5,1,6);
    auVar5 = vpinsrb_avx(auVar5,1,7);
    auVar5 = vpinsrb_avx(auVar5,1,8);
    auVar5 = vpinsrb_avx(auVar5,1,9);
    auVar5 = vpinsrb_avx(auVar5,1,10);
    auVar5 = vpinsrb_avx(auVar5,1,0xb);
    auVar5 = vpinsrb_avx(auVar5,1,0xc);
    auVar5 = vpinsrb_avx(auVar5,1,0xd);
    auVar5 = vpinsrb_avx(auVar5,1,0xe);
    auVar5 = vpinsrb_avx(auVar5,1,0xf);
    uStack_210 = auVar5._0_8_;
    uStack_208 = auVar5._8_8_;
    auVar25._16_8_ = local_2050;
    auVar25._0_16_ = *pauVar1;
    auVar25._24_8_ = uStack_2048;
    auVar24._16_8_ = uStack_210;
    auVar24._0_16_ = auVar3;
    auVar24._24_8_ = uStack_208;
    auVar10 = vpsubusb_avx2(auVar25,auVar24);
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auVar3 = vpinsrb_avx(auVar3,1,0xf);
    auVar5 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar5 = vpinsrb_avx(auVar5,1,2);
    auVar5 = vpinsrb_avx(auVar5,1,3);
    auVar5 = vpinsrb_avx(auVar5,1,4);
    auVar5 = vpinsrb_avx(auVar5,1,5);
    auVar5 = vpinsrb_avx(auVar5,1,6);
    auVar5 = vpinsrb_avx(auVar5,1,7);
    auVar5 = vpinsrb_avx(auVar5,1,8);
    auVar5 = vpinsrb_avx(auVar5,1,9);
    auVar5 = vpinsrb_avx(auVar5,1,10);
    auVar5 = vpinsrb_avx(auVar5,1,0xb);
    auVar5 = vpinsrb_avx(auVar5,1,0xc);
    auVar5 = vpinsrb_avx(auVar5,1,0xd);
    auVar5 = vpinsrb_avx(auVar5,1,0xe);
    auVar5 = vpinsrb_avx(auVar5,1,0xf);
    uStack_1d0 = auVar5._0_8_;
    uStack_1c8 = auVar5._8_8_;
    auVar23._16_8_ = local_2070;
    auVar23._0_16_ = auVar4;
    auVar23._24_8_ = uStack_2068;
    auVar22._16_8_ = uStack_1d0;
    auVar22._0_16_ = auVar3;
    auVar22._24_8_ = uStack_1c8;
    auVar11 = vpsubusb_avx2(auVar23,auVar22);
    auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar3 = vpinsrb_avx(auVar3,1,2);
    auVar3 = vpinsrb_avx(auVar3,1,3);
    auVar3 = vpinsrb_avx(auVar3,1,4);
    auVar3 = vpinsrb_avx(auVar3,1,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,1,9);
    auVar3 = vpinsrb_avx(auVar3,1,10);
    auVar3 = vpinsrb_avx(auVar3,1,0xb);
    auVar3 = vpinsrb_avx(auVar3,1,0xc);
    auVar3 = vpinsrb_avx(auVar3,1,0xd);
    auVar3 = vpinsrb_avx(auVar3,1,0xe);
    auVar3 = vpinsrb_avx(auVar3,1,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar4 = vpinsrb_avx(auVar4,1,2);
    auVar4 = vpinsrb_avx(auVar4,1,3);
    auVar4 = vpinsrb_avx(auVar4,1,4);
    auVar4 = vpinsrb_avx(auVar4,1,5);
    auVar4 = vpinsrb_avx(auVar4,1,6);
    auVar4 = vpinsrb_avx(auVar4,1,7);
    auVar4 = vpinsrb_avx(auVar4,1,8);
    auVar4 = vpinsrb_avx(auVar4,1,9);
    auVar4 = vpinsrb_avx(auVar4,1,10);
    auVar4 = vpinsrb_avx(auVar4,1,0xb);
    auVar4 = vpinsrb_avx(auVar4,1,0xc);
    auVar4 = vpinsrb_avx(auVar4,1,0xd);
    auVar4 = vpinsrb_avx(auVar4,1,0xe);
    auVar4 = vpinsrb_avx(auVar4,1,0xf);
    uStack_190 = auVar4._0_8_;
    uStack_188 = auVar4._8_8_;
    auVar21._16_8_ = local_20d0;
    auVar21._0_16_ = auVar34;
    auVar21._24_8_ = uStack_20c8;
    auVar20._16_8_ = uStack_190;
    auVar20._0_16_ = auVar3;
    auVar20._24_8_ = uStack_188;
    auVar12 = vpsubusb_avx2(auVar21,auVar20);
    auVar9 = vpavgb_avx2(auVar10,ZEXT1632(ZEXT816(0)));
    auVar9 = vpavgb_avx2(auVar10,auVar9);
    auVar10 = vpavgb_avx2(auVar11,ZEXT1632(ZEXT816(0)));
    auVar10 = vpavgb_avx2(auVar11,auVar10);
    auVar11 = vpavgb_avx2(auVar12,ZEXT1632(ZEXT816(0)));
    auVar11 = vpavgb_avx2(auVar12,auVar11);
    auVar9 = vpsrlw_avx2(auVar9,ZEXT416(6));
    auVar3 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar3 = vpinsrb_avx(auVar3,3,2);
    auVar3 = vpinsrb_avx(auVar3,3,3);
    auVar3 = vpinsrb_avx(auVar3,3,4);
    auVar3 = vpinsrb_avx(auVar3,3,5);
    auVar3 = vpinsrb_avx(auVar3,3,6);
    auVar3 = vpinsrb_avx(auVar3,3,7);
    auVar3 = vpinsrb_avx(auVar3,3,8);
    auVar3 = vpinsrb_avx(auVar3,3,9);
    auVar3 = vpinsrb_avx(auVar3,3,10);
    auVar3 = vpinsrb_avx(auVar3,3,0xb);
    auVar3 = vpinsrb_avx(auVar3,3,0xc);
    auVar3 = vpinsrb_avx(auVar3,3,0xd);
    auVar3 = vpinsrb_avx(auVar3,3,0xe);
    auVar3 = vpinsrb_avx(auVar3,3,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar4 = vpinsrb_avx(auVar4,3,2);
    auVar4 = vpinsrb_avx(auVar4,3,3);
    auVar4 = vpinsrb_avx(auVar4,3,4);
    auVar4 = vpinsrb_avx(auVar4,3,5);
    auVar4 = vpinsrb_avx(auVar4,3,6);
    auVar4 = vpinsrb_avx(auVar4,3,7);
    auVar4 = vpinsrb_avx(auVar4,3,8);
    auVar4 = vpinsrb_avx(auVar4,3,9);
    auVar4 = vpinsrb_avx(auVar4,3,10);
    auVar4 = vpinsrb_avx(auVar4,3,0xb);
    auVar4 = vpinsrb_avx(auVar4,3,0xc);
    auVar4 = vpinsrb_avx(auVar4,3,0xd);
    auVar4 = vpinsrb_avx(auVar4,3,0xe);
    auVar4 = vpinsrb_avx(auVar4,3,0xf);
    uStack_150 = auVar4._0_8_;
    uStack_148 = auVar4._8_8_;
    auVar14._16_8_ = uStack_150;
    auVar14._0_16_ = auVar3;
    auVar14._24_8_ = uStack_148;
    auVar9 = vpand_avx2(auVar9,auVar14);
    auVar10 = vpsrlw_avx2(auVar10,ZEXT416(6));
    auVar3 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar3 = vpinsrb_avx(auVar3,3,2);
    auVar3 = vpinsrb_avx(auVar3,3,3);
    auVar3 = vpinsrb_avx(auVar3,3,4);
    auVar3 = vpinsrb_avx(auVar3,3,5);
    auVar3 = vpinsrb_avx(auVar3,3,6);
    auVar3 = vpinsrb_avx(auVar3,3,7);
    auVar3 = vpinsrb_avx(auVar3,3,8);
    auVar3 = vpinsrb_avx(auVar3,3,9);
    auVar3 = vpinsrb_avx(auVar3,3,10);
    auVar3 = vpinsrb_avx(auVar3,3,0xb);
    auVar3 = vpinsrb_avx(auVar3,3,0xc);
    auVar3 = vpinsrb_avx(auVar3,3,0xd);
    auVar3 = vpinsrb_avx(auVar3,3,0xe);
    auVar3 = vpinsrb_avx(auVar3,3,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar4 = vpinsrb_avx(auVar4,3,2);
    auVar4 = vpinsrb_avx(auVar4,3,3);
    auVar4 = vpinsrb_avx(auVar4,3,4);
    auVar4 = vpinsrb_avx(auVar4,3,5);
    auVar4 = vpinsrb_avx(auVar4,3,6);
    auVar4 = vpinsrb_avx(auVar4,3,7);
    auVar4 = vpinsrb_avx(auVar4,3,8);
    auVar4 = vpinsrb_avx(auVar4,3,9);
    auVar4 = vpinsrb_avx(auVar4,3,10);
    auVar4 = vpinsrb_avx(auVar4,3,0xb);
    auVar4 = vpinsrb_avx(auVar4,3,0xc);
    auVar4 = vpinsrb_avx(auVar4,3,0xd);
    auVar4 = vpinsrb_avx(auVar4,3,0xe);
    auVar4 = vpinsrb_avx(auVar4,3,0xf);
    uStack_110 = auVar4._0_8_;
    uStack_108 = auVar4._8_8_;
    auVar13._16_8_ = uStack_110;
    auVar13._0_16_ = auVar3;
    auVar13._24_8_ = uStack_108;
    auVar10 = vpand_avx2(auVar10,auVar13);
    auVar11 = vpsrlw_avx2(auVar11,ZEXT416(6));
    auVar3 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar3 = vpinsrb_avx(auVar3,3,2);
    auVar3 = vpinsrb_avx(auVar3,3,3);
    auVar3 = vpinsrb_avx(auVar3,3,4);
    auVar3 = vpinsrb_avx(auVar3,3,5);
    auVar3 = vpinsrb_avx(auVar3,3,6);
    auVar3 = vpinsrb_avx(auVar3,3,7);
    auVar3 = vpinsrb_avx(auVar3,3,8);
    auVar3 = vpinsrb_avx(auVar3,3,9);
    auVar3 = vpinsrb_avx(auVar3,3,10);
    auVar3 = vpinsrb_avx(auVar3,3,0xb);
    auVar3 = vpinsrb_avx(auVar3,3,0xc);
    auVar3 = vpinsrb_avx(auVar3,3,0xd);
    auVar3 = vpinsrb_avx(auVar3,3,0xe);
    auVar3 = vpinsrb_avx(auVar3,3,0xf);
    auVar4 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar4 = vpinsrb_avx(auVar4,3,2);
    auVar4 = vpinsrb_avx(auVar4,3,3);
    auVar4 = vpinsrb_avx(auVar4,3,4);
    auVar4 = vpinsrb_avx(auVar4,3,5);
    auVar4 = vpinsrb_avx(auVar4,3,6);
    auVar4 = vpinsrb_avx(auVar4,3,7);
    auVar4 = vpinsrb_avx(auVar4,3,8);
    auVar4 = vpinsrb_avx(auVar4,3,9);
    auVar4 = vpinsrb_avx(auVar4,3,10);
    auVar4 = vpinsrb_avx(auVar4,3,0xb);
    auVar4 = vpinsrb_avx(auVar4,3,0xc);
    auVar4 = vpinsrb_avx(auVar4,3,0xd);
    auVar4 = vpinsrb_avx(auVar4,3,0xe);
    auVar4 = vpinsrb_avx(auVar4,3,0xf);
    uStack_d0 = auVar4._0_8_;
    uStack_c8 = auVar4._8_8_;
    auVar12._16_8_ = uStack_d0;
    auVar12._0_16_ = auVar3;
    auVar12._24_8_ = uStack_c8;
    auVar11 = vpand_avx2(auVar11,auVar12);
    auVar9 = vpmaddubsw_avx2(auVar9,*(undefined1 (*) [32])(in_R9 + 0xa4 + (long)local_1e44 * 0x124))
    ;
    auVar10 = vpmaddubsw_avx2(auVar10,*(undefined1 (*) [32])
                                       (in_R9 + 0xc4 + (long)local_1e44 * 0x124));
    auVar11 = vpmaddubsw_avx2(auVar11,*(undefined1 (*) [32])
                                       (in_R9 + 0xe4 + (long)local_1e44 * 0x124));
    auVar6 = vpaddw_avx2(auVar6,auVar9);
    auVar7 = vpaddw_avx2(auVar7,auVar10);
    auVar8 = vpaddw_avx2(auVar8,auVar11);
    auVar9 = *(undefined1 (*) [32])(in_R9 + 0x104 + (long)local_1e44 * 0x124);
    fVar33 = *(float *)(in_R9 + (long)local_1e44 * 0x124);
    fVar32 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + 0x34 + (long)local_1e44 * 0x36));
    fVar33 = fVar33 * fVar32;
    auVar3 = vinsertps_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar33),0x20);
    vinsertps_avx(auVar3,ZEXT416((uint)fVar33),0x30);
    auVar3 = vinsertps_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar33),0x20);
    vinsertps_avx(auVar3,ZEXT416((uint)fVar33),0x30);
    auVar9 = vpsubw_avx2(auVar6,auVar9);
    auVar6 = vpaddw_avx2(auVar7,auVar8);
    auVar6 = vpaddw_avx2(auVar9,auVar6);
    auVar3 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar3 = vpinsrw_avx(auVar3,1,2);
    auVar3 = vpinsrw_avx(auVar3,1,3);
    auVar3 = vpinsrw_avx(auVar3,1,4);
    auVar3 = vpinsrw_avx(auVar3,1,5);
    auVar3 = vpinsrw_avx(auVar3,1,6);
    auVar3 = vpinsrw_avx(auVar3,1,7);
    auVar4 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar4 = vpinsrw_avx(auVar4,1,2);
    auVar4 = vpinsrw_avx(auVar4,1,3);
    auVar4 = vpinsrw_avx(auVar4,1,4);
    auVar4 = vpinsrw_avx(auVar4,1,5);
    auVar4 = vpinsrw_avx(auVar4,1,6);
    auVar4 = vpinsrw_avx(auVar4,1,7);
    auVar34 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
    uStack_770 = auVar34._0_8_;
    uStack_768 = auVar34._8_8_;
    auVar30._16_8_ = uStack_770;
    auVar30._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
    auVar30._24_8_ = uStack_768;
    auVar6 = vpmaddwd_avx2(auVar6,auVar30);
    vcvtdq2ps_avx(auVar6);
    local_1e44 = local_1e44 + 1;
  }
  x_00[2] = (float)in_stack_ffffffffffffde20._0_4_;
  x_00[3] = (float)in_stack_ffffffffffffde20._4_4_;
  x_00[4] = (float)in_stack_ffffffffffffde20._8_4_;
  x_00[5] = (float)in_stack_ffffffffffffde20._12_4_;
  x_00[6] = (float)in_stack_ffffffffffffde20._16_4_;
  x_00[7] = (float)in_stack_ffffffffffffde20._20_4_;
  x_00[0] = (float)(int)in_stack_ffffffffffffde18;
  x_00[1] = (float)(int)((ulong)in_stack_ffffffffffffde18 >> 0x20);
  fVar33 = hsum_float_8(x_00);
  *in_RSI = fVar33;
  return;
}

Assistant:

void ggml_vec_dot_tq1_0_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_tq1_0 * GGML_RESTRICT x = vx;
    const block_q8_K  * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined(__ARM_NEON)
    float sumf = 0.0f;

    uint8_t k_shift[16] = {1, 1, 1, 1, 3, 3, 3, 3, 9, 9, 9, 9, 27, 27, 27, 27};

    const uint8x16_t shift = vld1q_u8(k_shift);

    for (int i = 0; i < nb; ++i) {
#if defined(__ARM_FEATURE_DOTPROD)
        int32x4_t sumi0 = vdupq_n_s32(0);
        int32x4_t sumi1 = vdupq_n_s32(0);
#else
        int16x8_t sumi0 = vdupq_n_s16(0);
        int16x8_t sumi1 = vdupq_n_s16(0);
#endif

        // first 32 bytes of 5 elements
        {
            uint8x16_t qx0 = vld1q_u8(x[i].qs + 0);
            uint8x16_t qx1 = vld1q_u8(x[i].qs + 16);
            uint8x16_t qx2 = vmulq_u8(qx0, vdupq_n_u8(3));
            uint8x16_t qx3 = vmulq_u8(qx1, vdupq_n_u8(3));
            uint8x16_t qx4 = vmulq_u8(qx0, vdupq_n_u8(9));
            uint8x16_t qx5 = vmulq_u8(qx1, vdupq_n_u8(9));
            uint8x16_t qx6 = vmulq_u8(qx0, vdupq_n_u8(27));
            uint8x16_t qx7 = vmulq_u8(qx1, vdupq_n_u8(27));
            uint8x16_t qx8 = vmulq_u8(qx0, vdupq_n_u8(81));
            uint8x16_t qx9 = vmulq_u8(qx1, vdupq_n_u8(81));

            // multiply by 3 and keep the 2 bits above 8 bits
            int8x16_t sqx0 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx0, vshrq_n_u8(qx0, 1)), 6));
            int8x16_t sqx1 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx1, vshrq_n_u8(qx1, 1)), 6));
            int8x16_t sqx2 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx2, vshrq_n_u8(qx2, 1)), 6));
            int8x16_t sqx3 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx3, vshrq_n_u8(qx3, 1)), 6));
            int8x16_t sqx4 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx4, vshrq_n_u8(qx4, 1)), 6));
            int8x16_t sqx5 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx5, vshrq_n_u8(qx5, 1)), 6));
            int8x16_t sqx6 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx6, vshrq_n_u8(qx6, 1)), 6));
            int8x16_t sqx7 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx7, vshrq_n_u8(qx7, 1)), 6));
            int8x16_t sqx8 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx8, vshrq_n_u8(qx8, 1)), 6));
            int8x16_t sqx9 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx9, vshrq_n_u8(qx9, 1)), 6));

            const int8x16_t qy0 = vld1q_s8(y[i].qs +   0);
            const int8x16_t qy1 = vld1q_s8(y[i].qs +  16);
            const int8x16_t qy2 = vld1q_s8(y[i].qs +  32);
            const int8x16_t qy3 = vld1q_s8(y[i].qs +  48);
            const int8x16_t qy4 = vld1q_s8(y[i].qs +  64);
            const int8x16_t qy5 = vld1q_s8(y[i].qs +  80);
            const int8x16_t qy6 = vld1q_s8(y[i].qs +  96);
            const int8x16_t qy7 = vld1q_s8(y[i].qs + 112);
            const int8x16_t qy8 = vld1q_s8(y[i].qs + 128);
            const int8x16_t qy9 = vld1q_s8(y[i].qs + 144);

#if defined(__ARM_FEATURE_DOTPROD)
            sumi0 = vdotq_s32(sumi0, sqx0, qy0);
            sumi1 = vdotq_s32(sumi1, sqx1, qy1);
            sumi0 = vdotq_s32(sumi0, sqx2, qy2);
            sumi1 = vdotq_s32(sumi1, sqx3, qy3);
            sumi0 = vdotq_s32(sumi0, sqx4, qy4);
            sumi1 = vdotq_s32(sumi1, sqx5, qy5);
            sumi0 = vdotq_s32(sumi0, sqx6, qy6);
            sumi1 = vdotq_s32(sumi1, sqx7, qy7);
            sumi0 = vdotq_s32(sumi0, sqx8, qy8);
            sumi1 = vdotq_s32(sumi1, sqx9, qy9);
#else
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx0), vget_low_s8(qy0));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx0), vget_high_s8(qy0));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx1), vget_low_s8(qy1));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx1), vget_high_s8(qy1));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx2), vget_low_s8(qy2));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx2), vget_high_s8(qy2));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx3), vget_low_s8(qy3));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx3), vget_high_s8(qy3));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx4), vget_low_s8(qy4));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx4), vget_high_s8(qy4));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx5), vget_low_s8(qy5));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx5), vget_high_s8(qy5));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx6), vget_low_s8(qy6));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx6), vget_high_s8(qy6));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx7), vget_low_s8(qy7));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx7), vget_high_s8(qy7));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx8), vget_low_s8(qy8));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx8), vget_high_s8(qy8));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx9), vget_low_s8(qy9));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx9), vget_high_s8(qy9));
#endif
        }

        // last 16 bytes of 5-element, along with the 4 bytes of 4 elements
        {
            uint8x16_t qx0 = vld1q_u8(x[i].qs + 32);
            uint8x16_t qx1 = vmulq_u8(qx0, vdupq_n_u8(3));
            uint8x16_t qx2 = vmulq_u8(qx0, vdupq_n_u8(9));
            uint8x16_t qx3 = vmulq_u8(qx0, vdupq_n_u8(27));
            uint8x16_t qx4 = vmulq_u8(qx0, vdupq_n_u8(81));
            uint32_t qh;
            memcpy(&qh, x[i].qh, sizeof(qh)); // potentially unaligned
            uint8x16_t qx5 = vreinterpretq_u8_u32(vdupq_n_u32(qh));
            qx5 = vmulq_u8(qx5, shift);

            // multiply by 3 and keep the 2 bits above 8 bits
            int8x16_t sqx0 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx0, vshrq_n_u8(qx0, 1)), 6));
            int8x16_t sqx1 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx1, vshrq_n_u8(qx1, 1)), 6));
            int8x16_t sqx2 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx2, vshrq_n_u8(qx2, 1)), 6));
            int8x16_t sqx3 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx3, vshrq_n_u8(qx3, 1)), 6));
            int8x16_t sqx4 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx4, vshrq_n_u8(qx4, 1)), 6));
            int8x16_t sqx5 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx5, vshrq_n_u8(qx5, 1)), 6));

            const int8x16_t qy0 = vld1q_s8(y[i].qs + 160);
            const int8x16_t qy1 = vld1q_s8(y[i].qs + 176);
            const int8x16_t qy2 = vld1q_s8(y[i].qs + 192);
            const int8x16_t qy3 = vld1q_s8(y[i].qs + 208);
            const int8x16_t qy4 = vld1q_s8(y[i].qs + 224);
            const int8x16_t qy5 = vld1q_s8(y[i].qs + 240);

#if defined(__ARM_FEATURE_DOTPROD)
            sumi0 = vdotq_s32(sumi0, sqx0, qy0);
            sumi1 = vdotq_s32(sumi1, sqx1, qy1);
            sumi0 = vdotq_s32(sumi0, sqx2, qy2);
            sumi1 = vdotq_s32(sumi1, sqx3, qy3);
            sumi0 = vdotq_s32(sumi0, sqx4, qy4);
            sumi1 = vdotq_s32(sumi1, sqx5, qy5);
#else
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx0), vget_low_s8(qy0));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx0), vget_high_s8(qy0));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx1), vget_low_s8(qy1));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx1), vget_high_s8(qy1));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx2), vget_low_s8(qy2));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx2), vget_high_s8(qy2));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx3), vget_low_s8(qy3));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx3), vget_high_s8(qy3));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx4), vget_low_s8(qy4));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx4), vget_high_s8(qy4));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx5), vget_low_s8(qy5));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx5), vget_high_s8(qy5));
#endif
        }

        const int16x8_t ysum0 = vld1q_s16(y[i].bsums);
        const int16x8_t ysum1 = vld1q_s16(y[i].bsums + 8);

        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;

#if defined(__ARM_FEATURE_DOTPROD)
        sumi0 = vaddq_s32(sumi0, sumi1);
        sumi0 = vsubq_s32(sumi0, vpaddlq_s16(vaddq_s16(ysum0, ysum1)));

        sumf += d * (float) vaddvq_s32(sumi0);
#else
        sumi0 = vaddq_s16(sumi0, sumi1);
        sumi0 = vsubq_s16(sumi0, vaddq_s16(ysum0, ysum1));

        sumf += d * (float) vaddlvq_s16(sumi0);
#endif
    }

    *s = sumf;

#elif defined(__AVX2__)
    __m256 sumf = _mm256_setzero_ps();

    for (int i = 0; i < nb; ++i) {
        // 16-bit sums
        __m256i sumi0 = _mm256_setzero_si256();
        __m256i sumi1 = _mm256_setzero_si256();
        __m256i sumi2 = _mm256_setzero_si256();

        // first 32 bytes of 5 elements
        {
            __m256i qx0 = _mm256_loadu_si256((const __m256i *) (x[i].qs));
            // 8-bit multiplies with shifts, masks and adds
            __m256i qx1 = _mm256_add_epi8(qx0, _mm256_add_epi8(qx0, qx0)); // 1 * 3
            __m256i qx2 = _mm256_add_epi8(_mm256_and_si256(_mm256_slli_epi16(qx0, 3), _mm256_set1_epi8(-8)), qx0); // 1 * 9
            __m256i qx3 = _mm256_add_epi8(_mm256_and_si256(_mm256_slli_epi16(qx1, 3), _mm256_set1_epi8(-8)), qx1); // 3 * 9
            __m256i qx4 = _mm256_add_epi8(_mm256_and_si256(_mm256_slli_epi16(qx2, 3), _mm256_set1_epi8(-8)), qx2); // 9 * 9

            // TODO: can _mm256_mulhi_epu16 be faster even if 16-bits?

            // Cancel the +1 from avg so that it behaves like a halving add
            qx0 = _mm256_subs_epu8(qx0, _mm256_set1_epi8(1));
            qx1 = _mm256_subs_epu8(qx1, _mm256_set1_epi8(1));
            qx2 = _mm256_subs_epu8(qx2, _mm256_set1_epi8(1));
            qx3 = _mm256_subs_epu8(qx3, _mm256_set1_epi8(1));
            qx4 = _mm256_subs_epu8(qx4, _mm256_set1_epi8(1));
            // Multiply by 3 and get the top 2 bits
            qx0 = _mm256_avg_epu8(qx0, _mm256_avg_epu8(qx0, _mm256_setzero_si256()));
            qx1 = _mm256_avg_epu8(qx1, _mm256_avg_epu8(qx1, _mm256_setzero_si256()));
            qx2 = _mm256_avg_epu8(qx2, _mm256_avg_epu8(qx2, _mm256_setzero_si256()));
            qx3 = _mm256_avg_epu8(qx3, _mm256_avg_epu8(qx3, _mm256_setzero_si256()));
            qx4 = _mm256_avg_epu8(qx4, _mm256_avg_epu8(qx4, _mm256_setzero_si256()));
            qx0 = _mm256_and_si256(_mm256_srli_epi16(qx0, 6), _mm256_set1_epi8(3));
            qx1 = _mm256_and_si256(_mm256_srli_epi16(qx1, 6), _mm256_set1_epi8(3));
            qx2 = _mm256_and_si256(_mm256_srli_epi16(qx2, 6), _mm256_set1_epi8(3));
            qx3 = _mm256_and_si256(_mm256_srli_epi16(qx3, 6), _mm256_set1_epi8(3));
            qx4 = _mm256_and_si256(_mm256_srli_epi16(qx4, 6), _mm256_set1_epi8(3));

            const __m256i qy0 = _mm256_loadu_si256((const __m256i *) (y[i].qs +   0));
            const __m256i qy1 = _mm256_loadu_si256((const __m256i *) (y[i].qs +  32));
            const __m256i qy2 = _mm256_loadu_si256((const __m256i *) (y[i].qs +  64));
            const __m256i qy3 = _mm256_loadu_si256((const __m256i *) (y[i].qs +  96));
            const __m256i qy4 = _mm256_loadu_si256((const __m256i *) (y[i].qs + 128));

            qx0 = _mm256_maddubs_epi16(qx0, qy0);
            qx1 = _mm256_maddubs_epi16(qx1, qy1);
            qx2 = _mm256_maddubs_epi16(qx2, qy2);
            qx3 = _mm256_maddubs_epi16(qx3, qy3);
            qx4 = _mm256_maddubs_epi16(qx4, qy4);

            sumi0 = _mm256_add_epi16(sumi0, _mm256_add_epi16(qx0, qx1));
            sumi1 = _mm256_add_epi16(sumi1, _mm256_add_epi16(qx2, qx3));
            sumi2 = _mm256_add_epi16(sumi2, qx4);
        }

        // last 16 bytes of 5-element, along with the 4 bytes of 4 elements
        {
            __m128i qx0 = _mm_loadu_si128((const __m128i *) (x[i].qs + 32));
            uint32_t qh;
            memcpy(&qh, x[i].qh, sizeof(qh)); // potentially unaligned
            __m256i qx5_l = _mm256_cvtepu8_epi16(_mm_set1_epi32(qh));
            __m128i qx1 = _mm_add_epi8(qx0, _mm_add_epi8(qx0, qx0)); // 1 * 3
            __m128i qx2 = _mm_add_epi8(_mm_and_si128(_mm_slli_epi16(qx0, 3), _mm_set1_epi8(-8)), qx0); // 1 * 9
            __m128i qx3 = _mm_add_epi8(_mm_and_si128(_mm_slli_epi16(qx1, 3), _mm_set1_epi8(-8)), qx1); // 3 * 9
            __m128i qx4 = _mm_add_epi8(_mm_and_si128(_mm_slli_epi16(qx2, 3), _mm_set1_epi8(-8)), qx2); // 9 * 9
            __m256i qx01 = MM256_SET_M128I(qx1, qx0);
            __m256i qx23 = MM256_SET_M128I(qx3, qx2);

            // avx2 does not have 8-bit multiplies, so 16-bit it is.
            qx5_l = _mm256_mullo_epi16(qx5_l, _mm256_set_epi16(27, 27, 27, 27, 9, 9, 9, 9, 3, 3, 3, 3, 1, 1, 1, 1));
            qx5_l = _mm256_and_si256(qx5_l, _mm256_set1_epi16(0xFF));
            __m128i qx5 = _mm_packus_epi16(_mm256_castsi256_si128(qx5_l), _mm256_extracti128_si256(qx5_l, 1));

            __m256i qx45 = MM256_SET_M128I(qx5, qx4);

            // Cancel the +1 from avg so that it behaves like a halving add
            qx01 = _mm256_subs_epu8(qx01, _mm256_set1_epi8(1));
            qx23 = _mm256_subs_epu8(qx23, _mm256_set1_epi8(1));
            qx45 = _mm256_subs_epu8(qx45, _mm256_set1_epi8(1));
            // Multiply by 3 and get the top 2 bits
            qx01 = _mm256_avg_epu8(qx01, _mm256_avg_epu8(qx01, _mm256_setzero_si256()));
            qx23 = _mm256_avg_epu8(qx23, _mm256_avg_epu8(qx23, _mm256_setzero_si256()));
            qx45 = _mm256_avg_epu8(qx45, _mm256_avg_epu8(qx45, _mm256_setzero_si256()));
            qx01 = _mm256_and_si256(_mm256_srli_epi16(qx01, 6), _mm256_set1_epi8(3));
            qx23 = _mm256_and_si256(_mm256_srli_epi16(qx23, 6), _mm256_set1_epi8(3));
            qx45 = _mm256_and_si256(_mm256_srli_epi16(qx45, 6), _mm256_set1_epi8(3));

            const __m256i qy01 = _mm256_loadu_si256((const __m256i *) (y[i].qs + 160));
            const __m256i qy23 = _mm256_loadu_si256((const __m256i *) (y[i].qs + 192));
            const __m256i qy45 = _mm256_loadu_si256((const __m256i *) (y[i].qs + 224));

            qx01 = _mm256_maddubs_epi16(qx01, qy01);
            qx23 = _mm256_maddubs_epi16(qx23, qy23);
            qx45 = _mm256_maddubs_epi16(qx45, qy45);

            sumi0 = _mm256_add_epi16(sumi0, qx01);
            sumi1 = _mm256_add_epi16(sumi1, qx23);
            sumi2 = _mm256_add_epi16(sumi2, qx45);
        }

        const __m256i ysum = _mm256_loadu_si256((const __m256i *) y[i].bsums);
        const __m256 d = _mm256_set1_ps(y[i].d * GGML_FP16_TO_FP32(x[i].d));

        sumi0 = _mm256_sub_epi16(sumi0, ysum);
        sumi0 = _mm256_add_epi16(sumi0, _mm256_add_epi16(sumi1, sumi2));
        sumi0 = _mm256_madd_epi16(sumi0, _mm256_set1_epi16(1));

        sumf = _mm256_add_ps(_mm256_mul_ps(_mm256_cvtepi32_ps(sumi0), d), sumf);
    }

    *s = hsum_float_8(sumf);

#else
    const uint8_t pow3[6] = {1, 3, 9, 27, 81, 243};

    float sumf = 0.0f;

    for (int i = 0; i < nb; ++i) {
        int sum = 0;

        for (size_t j = 0; j < sizeof(x->qs) - sizeof(x->qs) % 32; j += 32) {
            for (size_t l = 0; l < 5; ++l) {
                for (size_t m = 0; m < 32; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[l];
                    uint16_t xi = ((uint16_t) q * 3) >> 8;
                    sum += (xi - 1) * y[i].qs[j*5 + l*32 + m];
                }
            }
        }
        for (size_t j = sizeof(x->qs) - sizeof(x->qs) % 32; j < sizeof(x->qs); j += 16) {
            for (size_t l = 0; l < 5; ++l) {
                for (size_t m = 0; m < 16; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[l];
                    uint16_t xi = ((uint16_t) q * 3) >> 8;
                    sum += (xi - 1) * y[i].qs[j*5 + l*16 + m];
                }
            }
        }

        for (size_t l = 0; l < 4; ++l) {
            for (size_t j = 0; j < sizeof(x->qh); ++j) {
                uint8_t q = x[i].qh[j] * pow3[l];
                uint16_t xi = ((uint16_t) q * 3) >> 8;
                sum += (xi - 1) * y[i].qs[sizeof(x->qs)*5 + l*sizeof(x->qh) + j];
            }
        }

        sumf += (float) sum * (GGML_FP16_TO_FP32(x[i].d) * y[i].d);
    }

    *s = sumf;
#endif
}